

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msd_lsd.cpp
# Opt level: O1

void msd_lsd<6u>(Cacheblock<6U> *cache,size_t N,size_t depth)

{
  undefined8 *puVar1;
  int iVar2;
  size_t i;
  uchar *puVar3;
  void *__src;
  long lVar4;
  Cacheblock<6U> *pCVar5;
  ulong uVar6;
  long lVar7;
  uchar *puVar8;
  ulong uVar9;
  ulong uVar10;
  size_t N_00;
  byte bVar11;
  ulong uVar12;
  byte bVar13;
  Cacheblock<6U> *pCVar14;
  long lVar15;
  long lVar16;
  bool bVar17;
  long local_1038 [256];
  long local_838 [257];
  
  lVar15 = depth + 1;
  while (0x1f < N) {
    fill_cache<6u>(cache,N,depth);
    puVar8 = (cache->chars)._M_elems + 5;
    lVar16 = 5;
    do {
      memset(local_1038 + 0x100,0,0x800);
      puVar3 = puVar8;
      uVar6 = N;
      do {
        local_1038[(ulong)*puVar3 + 0x100] = local_1038[(ulong)*puVar3 + 0x100] + 1;
        puVar3 = puVar3 + 0x10;
        uVar6 = uVar6 - 1;
      } while (uVar6 != 0);
      __src = malloc(N << 4);
      local_1038[0] = 0;
      lVar4 = 1;
      lVar7 = 0;
      do {
        lVar7 = lVar7 + local_1038[lVar4 + 0xff];
        local_1038[lVar4] = lVar7;
        lVar4 = lVar4 + 1;
        pCVar5 = cache;
        uVar6 = N;
      } while (lVar4 != 0x100);
      do {
        bVar11 = (pCVar5->chars)._M_elems[lVar16];
        lVar4 = local_1038[bVar11];
        local_1038[bVar11] = lVar4 + 1;
        puVar3 = pCVar5->ptr;
        puVar1 = (undefined8 *)((long)__src + lVar4 * 0x10);
        *puVar1 = *(undefined8 *)pCVar5;
        puVar1[1] = puVar3;
        uVar6 = uVar6 - 1;
        pCVar5 = pCVar5 + 1;
      } while (uVar6 != 0);
      memcpy(cache,__src,N << 4);
      free(__src);
      puVar8 = puVar8 + -1;
      bVar17 = lVar16 != 0;
      lVar16 = lVar16 + -1;
    } while (bVar17);
    if (N == 1) {
      uVar10 = 1;
      uVar6 = 0;
    }
    else {
      uVar9 = 1;
      N_00 = 1;
      uVar12 = 0;
      pCVar5 = cache;
      do {
        if (*(short *)((pCVar5->chars)._M_elems + 4) == *(short *)(pCVar5[1].chars._M_elems + 4) &&
            *(int *)(pCVar5->chars)._M_elems == *(int *)pCVar5[1].chars._M_elems) {
          uVar10 = N_00 + 1;
          uVar6 = uVar12;
        }
        else {
          uVar10 = 1;
          uVar6 = uVar9;
          if ((1 < N_00) && (cache[uVar12].chars._M_elems[5] != '\0')) {
            msd_lsd<6u>(cache + uVar12,N_00,depth + 6);
          }
        }
        uVar9 = uVar9 + 1;
        pCVar5 = pCVar5 + 1;
        N_00 = uVar10;
        uVar12 = uVar6;
      } while (N != uVar9);
    }
    if (uVar10 < 2) {
      return;
    }
    if (cache[uVar6].chars._M_elems[5] == '\0') {
      return;
    }
    cache = cache + uVar6;
    depth = depth + 6;
    lVar15 = lVar15 + 6;
    N = uVar10;
  }
  pCVar5 = cache;
  if (1 < (long)N) {
    do {
      puVar8 = pCVar5[1].ptr;
      for (pCVar14 = pCVar5 + 1; cache < pCVar14; pCVar14 = pCVar14 + -1) {
        puVar3 = pCVar14[-1].ptr;
        bVar11 = puVar3[depth];
        bVar13 = puVar8[depth];
        if ((bVar11 != 0) && (lVar16 = lVar15, bVar11 == bVar13)) {
          do {
            bVar11 = puVar3[lVar16];
            bVar13 = puVar8[lVar16];
            if (bVar11 == 0) break;
            lVar16 = lVar16 + 1;
          } while (bVar11 == bVar13);
        }
        if (bVar11 <= bVar13) break;
        pCVar14->ptr = puVar3;
      }
      iVar2 = (int)N;
      pCVar14->ptr = puVar8;
      N = (size_t)(iVar2 - 1);
      pCVar5 = pCVar5 + 1;
    } while (2 < iVar2);
  }
  return;
}

Assistant:

static void
msd_lsd(Cacheblock<CachedChars>* cache, size_t N, size_t depth)
{
	static_assert(CachedChars>=1, "CachedChars must be positive");
	if (N < 32) {
		insertion_sort(cache, N, depth);
		return;
	}
	fill_cache(cache, N, depth);
	for (int byte=CachedChars-1; byte >= 0; --byte) {
		size_t bucketsize[256] = {0};
		for (size_t i=0; i < N; ++i)
			++bucketsize[cache[i].chars[byte]];
		Cacheblock<CachedChars>* sorted = (Cacheblock<CachedChars>*)
			malloc(N*sizeof(Cacheblock<CachedChars>));
		size_t bucketindex[256];
		bucketindex[0] = 0;
		for (size_t i=1; i < 256; ++i)
			bucketindex[i] = bucketindex[i-1] + bucketsize[i-1];
		for (size_t i=0; i < N; ++i)
			memcpy(&sorted[bucketindex[cache[i].chars[byte]]++],
					cache+i,
					sizeof(Cacheblock<CachedChars>));
		memcpy(cache, sorted, N*sizeof(Cacheblock<CachedChars>));
		free(sorted);
	}
	size_t start=0, cnt=1;
	for (size_t i=0; i < N-1; ++i) {
		if (memcmp(cache[i].chars.data(), cache[i+1].chars.data(),
				CachedChars) == 0) {
			++cnt;
			continue;
		}
		if (cnt > 1 && cache[start].chars[CachedChars-1] != 0) {
			msd_lsd(cache+start, cnt, depth+CachedChars);
		}
		cnt = 1;
		start = i+1;
	}
	if (cnt > 1 && cache[start].chars[CachedChars-1] != 0) {
		msd_lsd(cache+start, cnt, depth+CachedChars);
	}
}